

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall sfc::Image::blit(Image *this,rgba_vec_t *rgba_data,uint x,uint y,uint width)

{
  pointer puVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    puVar1 = (rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= (ulong)uVar2
       ) break;
    set_pixel(this,puVar1[uVar2],uVar2 % width + x,uVar2 / width + y);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Image::blit(const rgba_vec_t& rgba_data, const unsigned x, const unsigned y, const unsigned width) {
  for (unsigned i = 0; i < rgba_data.size(); ++i)
    set_pixel(rgba_data[i], (i % width) + x, (i / width) + y);
}